

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManComputeOverlap2One(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  
  vVisit->nSize = 0;
  if (-1 < iObj) {
    pVVar6 = p->vMapping;
    uVar5 = pVVar6->nSize;
    if (iObj < (int)uVar5) {
      lVar4 = 0;
      do {
        piVar2 = pVVar6->pArray;
        lVar7 = (long)piVar2[(uint)iObj];
        if ((lVar7 < 0) || (uVar5 <= (uint)piVar2[(uint)iObj])) break;
        if (piVar2[lVar7] <= lVar4) {
          iVar3 = Gia_ManComputeOverlap2One_rec(p,iObj,vLabel,vVisit);
          pVVar6 = p->vMapping;
          uVar5 = pVVar6->nSize;
          if (iObj < (int)uVar5) {
            lVar4 = 0;
            goto LAB_0020b9f9;
          }
          break;
        }
        iVar3 = piVar2[lVar7 + lVar4 + 1];
        if (((long)iVar3 < 0) || (vLabel->nSize <= iVar3)) goto LAB_0020ba97;
        vLabel->pArray[iVar3] = '\x01';
        lVar4 = lVar4 + 1;
        pVVar6 = p->vMapping;
        uVar5 = pVVar6->nSize;
      } while (iObj < (int)uVar5);
    }
  }
  goto LAB_0020ba40;
LAB_0020b9f9:
  do {
    piVar2 = pVVar6->pArray;
    lVar7 = (long)piVar2[(uint)iObj];
    if ((lVar7 < 0) || (uVar5 <= (uint)piVar2[(uint)iObj])) break;
    if (piVar2[lVar7] <= lVar4) {
      if (0 < vVisit->nSize) {
        lVar4 = 0;
        do {
          iVar1 = vVisit->pArray[lVar4];
          if (((long)iVar1 < 0) || (vLabel->nSize <= iVar1)) {
LAB_0020ba97:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
          }
          vLabel->pArray[iVar1] = '\0';
          lVar4 = lVar4 + 1;
        } while (lVar4 < vVisit->nSize);
      }
      return iVar3;
    }
    iVar1 = piVar2[lVar7 + lVar4 + 1];
    if (((long)iVar1 < 0) || (vLabel->nSize <= iVar1)) goto LAB_0020ba97;
    vLabel->pArray[iVar1] = '\0';
    lVar4 = lVar4 + 1;
    pVVar6 = p->vMapping;
    uVar5 = pVVar6->nSize;
  } while (iObj < (int)uVar5);
LAB_0020ba40:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ManComputeOverlap2One( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    int iFan, k, Counter;
    Vec_IntClear( vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 1 );
    Counter = Gia_ManComputeOverlap2One_rec( p, iObj, vLabel, vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    Vec_IntForEachEntry( vVisit, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    return Counter;
}